

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::GetTypeUrl_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,StringPiece message_name,
          StringPiece type_url_prefix)

{
  char cVar1;
  AlphaNum *b;
  AlphaNum *c;
  AlphaNum local_c0;
  AlphaNum *local_90;
  char *pcStack_88;
  AlphaNum local_60;
  undefined1 auStack_30 [8];
  StringPiece type_url_prefix_local;
  
  type_url_prefix_local.ptr_ = type_url_prefix.ptr_;
  b = (AlphaNum *)message_name.length_;
  c = (AlphaNum *)type_url_prefix_local.ptr_;
  auStack_30 = (undefined1  [8])b;
  if ((AlphaNum *)type_url_prefix_local.ptr_ != (AlphaNum *)0x0) {
    c = (AlphaNum *)(((AlphaNum *)((long)type_url_prefix_local.ptr_ + -0x30))->digits + 0x1f);
    cVar1 = StringPiece::operator[]((StringPiece *)auStack_30,(stringpiece_ssize_type)c);
    if (cVar1 == '/') {
      local_90 = (AlphaNum *)auStack_30;
      pcStack_88 = type_url_prefix_local.ptr_;
      local_60.piece_data_ = (char *)this;
      local_60.piece_size_ = (size_t)message_name.ptr_;
      StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_90,&local_60,b);
      return __return_storage_ptr__;
    }
  }
  local_90 = (AlphaNum *)auStack_30;
  pcStack_88 = type_url_prefix_local.ptr_;
  local_60.piece_data_ = "/";
  local_60.piece_size_ = 1;
  local_c0.piece_data_ = (char *)this;
  local_c0.piece_size_ = (size_t)message_name.ptr_;
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_90,&local_60,&local_c0,c);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeUrl(StringPiece message_name,
                       StringPiece type_url_prefix) {
  if (!type_url_prefix.empty() &&
      type_url_prefix[type_url_prefix.size() - 1] == '/') {
    return StrCat(type_url_prefix, message_name);
  } else {
    return StrCat(type_url_prefix, "/", message_name);
  }
}